

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O3

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,char *value)

{
  size_t sVar1;
  char *__s;
  
  __s = "";
  if (value != (char *)0x0) {
    __s = value;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand::ValueToString(
  const char* value) const
{
  std::string safe_string = value ? value : "";
  return safe_string;
}